

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-listen.c
# Opt level: O1

int rops_handle_POLLIN_listen(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  lws_context *plVar1;
  lws_vhost *vh;
  lws_adoption_type type;
  lws_sock_file_fd_type fd;
  int iVar2;
  lws_adoption_type lVar3;
  int *piVar4;
  char *pcVar5;
  lws *plVar6;
  socklen_t clilen;
  sockaddr_storage cli_addr;
  int local_c0;
  socklen_t local_bc;
  sockaddr local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  plVar1 = wsi->context;
  local_b8.sa_family = 0;
  local_b8.sa_data[0] = '\0';
  local_b8.sa_data[1] = '\0';
  local_b8.sa_data[2] = '\0';
  local_b8.sa_data[3] = '\0';
  local_b8.sa_data[4] = '\0';
  local_b8.sa_data[5] = '\0';
  local_b8.sa_data[6] = '\0';
  local_b8.sa_data[7] = '\0';
  local_b8.sa_data[8] = '\0';
  local_b8.sa_data[9] = '\0';
  local_b8.sa_data[10] = '\0';
  local_b8.sa_data[0xb] = '\0';
  local_b8.sa_data[0xc] = '\0';
  local_b8.sa_data[0xd] = '\0';
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  if ((wsi->vhost->field_0x2b4 & 4) != 0) {
    return 5;
  }
  do {
    iVar2 = 2;
    if ((((pollfd->revents & 5) != 0) && ((pollfd->events & 1) != 0)) &&
       (((wsi->vhost->tls).use_ssl == 0 ||
        ((plVar1->simultaneous_ssl_restriction == 0 ||
         (plVar1->simultaneous_ssl != plVar1->simultaneous_ssl_restriction)))))) {
      local_bc = 0x80;
      fd.sockfd = accept(pollfd->fd,&local_b8,&local_bc);
      if (fd.sockfd == -1) {
        piVar4 = __errno_location();
        if (*piVar4 != 0xb) {
          pcVar5 = strerror(*piVar4);
          iVar2 = 1;
          _lws_log(1,"accept: %s\n",pcVar5);
          local_c0 = 5;
        }
      }
      else {
        if ((plVar1->field_0x510 & 4) == 0) {
          lws_plat_set_socket_options(wsi->vhost,fd.sockfd,0);
          _lws_log(0x10,"accepted new conn port %u on fd=%d\n",
                   (ulong)(ushort)(local_b8.sa_data._0_2_ << 8 | (ushort)local_b8.sa_data._0_2_ >> 8
                                  ),(ulong)(uint)fd.sockfd);
          iVar2 = (*wsi->vhost->protocols->callback)
                            (wsi,LWS_CALLBACK_FILTER_NETWORK_CONNECTION,(void *)0x0,
                             (void *)(long)fd.sockfd,0);
          if (iVar2 == 0) {
            vh = wsi->vhost;
            lVar3 = (LWS_ADOPT_ALLOW_SSL|LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP) -
                    (((uint)vh->options >> 0x16 & 1) != 0);
            type = lVar3 & (LWS_ADOPT_SOCKET|LWS_ADOPT_HTTP);
            if ((vh->tls).use_ssl != 0) {
              type = lVar3;
            }
            iVar2 = 0;
            plVar6 = lws_adopt_descriptor_vhost(vh,type,fd,(char *)0x0,(lws *)0x0);
            if (plVar6 == (lws *)0x0) {
              _lws_log(8,"%s: vh %s: adopt failed\n","rops_handle_POLLIN_listen",wsi->vhost->name);
              local_c0 = 4;
              iVar2 = 1;
            }
            goto LAB_0013a59f;
          }
          _lws_log(0x10,"Callback denied net connection\n");
        }
        close(fd.sockfd);
        local_c0 = 6;
        iVar2 = 1;
      }
    }
LAB_0013a59f:
    if (iVar2 != 0) {
      if (iVar2 == 2) {
        return 5;
      }
      return local_c0;
    }
    if (plVar1->fd_limit_per_thread - 1 <= pt->fds_count) {
      return 5;
    }
    if ((long)wsi->position_in_fds_table == -1) {
      return 5;
    }
    iVar2 = lws_poll_listen_fd(pt->fds + wsi->position_in_fds_table);
    if (iVar2 < 1) {
      return 5;
    }
  } while( true );
}

Assistant:

static int
rops_handle_POLLIN_listen(struct lws_context_per_thread *pt, struct lws *wsi,
			  struct lws_pollfd *pollfd)
{
	struct lws_context *context = wsi->context;
	lws_sockfd_type accept_fd = LWS_SOCK_INVALID;
	lws_sock_file_fd_type fd;
	struct sockaddr_storage cli_addr;
	socklen_t clilen;

	memset(&cli_addr, 0, sizeof(cli_addr));

	/* if our vhost is going down, ignore it */

	if (wsi->vhost->being_destroyed)
		return LWS_HPI_RET_HANDLED;

	/* pollin means a client has connected to us then
	 *
	 * pollout is a hack on esp32 for background accepts signalling
	 * they completed
	 */

	do {
		struct lws *cwsi;
		int opts = LWS_ADOPT_SOCKET | LWS_ADOPT_ALLOW_SSL;

		if (!(pollfd->revents & (LWS_POLLIN | LWS_POLLOUT)) ||
		    !(pollfd->events & LWS_POLLIN))
			break;

#if defined(LWS_WITH_TLS)
		/*
		 * can we really accept it, with regards to SSL limit?
		 * another vhost may also have had POLLIN on his
		 * listener this round and used it up already
		 */
		if (wsi->vhost->tls.use_ssl &&
		    context->simultaneous_ssl_restriction &&
		    context->simultaneous_ssl ==
				  context->simultaneous_ssl_restriction)
			/*
			 * no... ignore it, he won't come again until
			 * we are below the simultaneous_ssl_restriction
			 * limit and POLLIN is enabled on him again
			 */
			break;
#endif
		/* listen socket got an unencrypted connection... */

		clilen = sizeof(cli_addr);

		/*
		 * We cannot identify the peer who is in the listen
		 * socket connect queue before we accept it; even if
		 * we could, not accepting it due to PEER_LIMITS would
		 * block the connect queue for other legit peers.
		 */

		accept_fd = accept((int)pollfd->fd,
				   (struct sockaddr *)&cli_addr, &clilen);
		if (accept_fd == LWS_SOCK_INVALID) {
			if (LWS_ERRNO == LWS_EAGAIN ||
			    LWS_ERRNO == LWS_EWOULDBLOCK) {
				break;
			}
			lwsl_err("accept: %s\n", strerror(LWS_ERRNO));
			return LWS_HPI_RET_HANDLED;
		}

		if (context->being_destroyed) {
			compatible_close(accept_fd);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		lws_plat_set_socket_options(wsi->vhost, accept_fd, 0);

#if defined(LWS_WITH_IPV6)
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			((cli_addr.ss_family == AF_INET6) ?
			ntohs(((struct sockaddr_in6 *) &cli_addr)->sin6_port) :
			ntohs(((struct sockaddr_in *) &cli_addr)->sin_port)),
			accept_fd);
#else
		{
		struct sockaddr_in sain;

		memcpy(&sain, &cli_addr, sizeof(sain));
		lwsl_debug("accepted new conn port %u on fd=%d\n",
			   ntohs(sain.sin_port),
			   accept_fd);
		}
#endif

		/*
		 * look at who we connected to and give user code a
		 * chance to reject based on client IP.  There's no
		 * protocol selected yet so we issue this to
		 * protocols[0]
		 */
		if ((wsi->vhost->protocols[0].callback)(wsi,
				LWS_CALLBACK_FILTER_NETWORK_CONNECTION,
				NULL,
				(void *)(lws_intptr_t)accept_fd, 0)) {
			lwsl_debug("Callback denied net connection\n");
			compatible_close(accept_fd);
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
		}

		if (!(wsi->vhost->options &
			LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG))
			opts |= LWS_ADOPT_HTTP;

#if defined(LWS_WITH_TLS)
		if (!wsi->vhost->tls.use_ssl)
#endif
			opts &= ~LWS_ADOPT_ALLOW_SSL;

		fd.sockfd = accept_fd;
		cwsi = lws_adopt_descriptor_vhost(wsi->vhost, opts, fd,
						  NULL, NULL);
		if (!cwsi) {
			lwsl_info("%s: vh %s: adopt failed\n", __func__,
					wsi->vhost->name);

			/* already closed cleanly as necessary */
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}
/*
		if (lws_server_socket_service_ssl(cwsi, accept_fd)) {
			lws_close_free_wsi(cwsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "listen svc fail");
			return LWS_HPI_RET_WSI_ALREADY_DIED;
		}

		lwsl_info("%s: new wsi %p: wsistate 0x%lx, role_ops %s\n",
			    __func__, cwsi, (unsigned long)cwsi->wsistate,
			    cwsi->role_ops->name);
*/

	} while (pt->fds_count < context->fd_limit_per_thread - 1 &&
		 wsi->position_in_fds_table != LWS_NO_FDS_POS &&
		 lws_poll_listen_fd(&pt->fds[wsi->position_in_fds_table]) > 0);

	return LWS_HPI_RET_HANDLED;
}